

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagator.h
# Opt level: O1

Clause * Reason_new(int sz)

{
  Clause *c;
  Clause *local_18;
  
  local_18 = (Clause *)malloc((ulong)(uint)sz * 4 + 8);
  *(uint *)local_18 = (*(uint *)local_18 & 0xfc) + sz * 0x100 + 2;
  vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_18);
  return local_18;
}

Assistant:

static inline Clause* Reason_new(int sz) {
	auto* c = (Clause*)malloc(sizeof(Clause) + sz * sizeof(Lit));
	c->clearFlags();
	c->temp_expl = 1;
	c->sz = sz;
	sat.rtrail.last().push(c);
	return c;
}